

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O2

int Ver_ParseMaxBoxSize(Vec_Ptr_t *vUndefs)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  int i;
  int i_00;
  int iVar4;
  
  iVar4 = 0;
  for (i = 0; i < vUndefs->nSize; i = i + 1) {
    pvVar2 = Vec_PtrEntry(vUndefs,i);
    for (i_00 = 0; i_00 < (*(Vec_Ptr_t **)((long)pvVar2 + 0x158))->nSize; i_00 = i_00 + 1) {
      pvVar3 = Vec_PtrEntry(*(Vec_Ptr_t **)((long)pvVar2 + 0x158),i_00);
      iVar1 = *(int *)(*(long *)((long)pvVar3 + 0x40) + 4);
      if (iVar4 <= iVar1) {
        iVar4 = iVar1;
      }
    }
  }
  return iVar4;
}

Assistant:

int Ver_ParseMaxBoxSize( Vec_Ptr_t * vUndefs )
{
    Abc_Ntk_t * pNtk;
    Abc_Obj_t * pBox;
    int i, k, nMaxSize = 0;
    // go through undef box types
    Vec_PtrForEachEntry( Abc_Ntk_t *, vUndefs, pNtk, i )
        // go through instances of this type
        Vec_PtrForEachEntry( Abc_Obj_t *, (Vec_Ptr_t *)pNtk->pData, pBox, k )
            // check the number of bundles of this instance
            if ( nMaxSize < Vec_PtrSize((Vec_Ptr_t *)pBox->pCopy) )
                nMaxSize = Vec_PtrSize((Vec_Ptr_t *)pBox->pCopy);
    return nMaxSize;
}